

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int fxp_got_status(sftp_packet *pktin)

{
  unsigned_long uVar1;
  sftp_packet *pktin_local;
  
  if (pktin->type == 0x65) {
    uVar1 = BinarySource_get_uint32(pktin->binarysource_);
    fxp_errtype = (int)uVar1;
    if (pktin->binarysource_[0].err == BSE_NO_ERROR) {
      if ((fxp_errtype < 0) || (8 < (uint)fxp_errtype)) {
        fxp_error_message = "unknown error code";
      }
      else {
        fxp_error_message = fxp_got_status::messages[fxp_errtype];
      }
    }
    else {
      fxp_error_message = "malformed FXP_STATUS packet";
      fxp_errtype = -1;
    }
  }
  else {
    fxp_error_message = "expected FXP_STATUS packet";
    fxp_errtype = -1;
  }
  if (fxp_errtype == 0) {
    pktin_local._4_4_ = 1;
  }
  else if (fxp_errtype == 1) {
    pktin_local._4_4_ = 0;
  }
  else {
    pktin_local._4_4_ = -1;
  }
  return pktin_local._4_4_;
}

Assistant:

static int fxp_got_status(struct sftp_packet *pktin)
{
    static const char *const messages[] = {
        /* SSH_FX_OK. The only time we will display a _message_ for this
         * is if we were expecting something other than FXP_STATUS on
         * success, so this is actually an error message! */
        "unexpected OK response",
        "end of file",
        "no such file or directory",
        "permission denied",
        "failure",
        "bad message",
        "no connection",
        "connection lost",
        "operation unsupported",
    };

    if (pktin->type != SSH_FXP_STATUS) {
        fxp_error_message = "expected FXP_STATUS packet";
        fxp_errtype = -1;
    } else {
        fxp_errtype = get_uint32(pktin);
        if (get_err(pktin)) {
            fxp_error_message = "malformed FXP_STATUS packet";
            fxp_errtype = -1;
        } else {
            if (fxp_errtype < 0 || fxp_errtype >= lenof(messages))
                fxp_error_message = "unknown error code";
            else
                fxp_error_message = messages[fxp_errtype];
        }
    }

    if (fxp_errtype == SSH_FX_OK)
        return 1;
    else if (fxp_errtype == SSH_FX_EOF)
        return 0;
    else
        return -1;
}